

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyformat.h
# Opt level: O2

void tinyformat::format<int,unsigned_int,unsigned_int>
               (ostream *out,char *fmt,int *args,uint *args_1,uint *args_2)

{
  long in_FS_OFFSET;
  FormatList local_60;
  FormatArg local_50;
  uint *local_38;
  code *local_30;
  code *local_28;
  uint *local_20;
  code *local_18;
  code *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_60.m_args = &local_50;
  local_60.m_N = 3;
  local_50.m_formatImpl = detail::FormatArg::formatImpl<int>;
  local_50.m_toIntImpl = detail::FormatArg::toIntImpl<int>;
  local_30 = detail::FormatArg::formatImpl<unsigned_int>;
  local_28 = detail::FormatArg::toIntImpl<unsigned_int>;
  local_18 = detail::FormatArg::formatImpl<unsigned_int>;
  local_10 = detail::FormatArg::toIntImpl<unsigned_int>;
  local_50.m_value = args;
  local_38 = args_1;
  local_20 = args_2;
  vformat(out,fmt,&local_60);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void format(std::ostream& out, const char* fmt, const Args&... args)
{
    vformat(out, fmt, makeFormatList(args...));
}